

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O0

void __thiscall
iffl::
flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
::attach(flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
         *this,char *buffer_begin,char *last_element,char *buffer_end)

{
  buffer_type *pbVar1;
  char *buffer_end_local;
  char *last_element_local;
  char *buffer_begin_local;
  flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
  *this_local;
  
  pbVar1 = buff(this);
  if (pbVar1->begin == buffer_begin) {
    std::terminate();
  }
  if (last_element == (char *)0x0) {
    if (buffer_end <= buffer_begin) {
      std::terminate();
    }
  }
  else if ((last_element <= buffer_begin) || (buffer_end <= last_element)) {
    std::terminate();
  }
  clear(this);
  pbVar1 = buff(this);
  pbVar1->begin = buffer_begin;
  pbVar1 = buff(this);
  pbVar1->end = buffer_end;
  pbVar1 = buff(this);
  pbVar1->last = last_element;
  return;
}

Assistant:

void attach(char *buffer_begin,
                char *last_element,
                char *buffer_end) noexcept {

        FFL_CODDING_ERROR_IF(buff().begin == buffer_begin);
        if (last_element) {
            FFL_CODDING_ERROR_IF_NOT(buffer_begin < last_element && last_element < buffer_end);
        } else {
            FFL_CODDING_ERROR_IF_NOT(buffer_begin < buffer_end);
        }
        clear();
        buff().begin = buffer_begin;
        buff().end = buffer_end;
        buff().last = last_element;
    }